

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript_tests.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
anon_unknown.dwarf_9a1342::KeyConverter::ToPKBytes
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          KeyConverter *this,CPubKey *key)

{
  bool bVar1;
  byte bVar2;
  allocator_type *__a;
  long lVar3;
  uchar *__last;
  long in_FS_OFFSET;
  allocator_type local_41;
  XOnlyPubKey xonly_pubkey;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = miniscript::IsTapscript(this->m_script_ctx);
  if (bVar1) {
    XOnlyPubKey::XOnlyPubKey(&xonly_pubkey,key);
    __last = (uchar *)&local_20;
    __a = &local_41;
    key = (CPubKey *)&xonly_pubkey;
  }
  else {
    if ((key->vch[0] & 0xfe) == 2) {
      lVar3 = 0x21;
    }
    else {
      bVar2 = key->vch[0] - 4;
      if (bVar2 < 4) {
        lVar3 = *(long *)(&DAT_00b5ace0 + (ulong)bVar2 * 8);
      }
      else {
        lVar3 = 0;
      }
    }
    __last = key->vch + lVar3;
    __a = (allocator_type *)&xonly_pubkey;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,key->vch,
             __last,__a);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<unsigned char> ToPKBytes(const CPubKey& key) const {
        if (!miniscript::IsTapscript(m_script_ctx)) {
            return {key.begin(), key.end()};
        }
        const XOnlyPubKey xonly_pubkey{key};
        return {xonly_pubkey.begin(), xonly_pubkey.end()};
    }